

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O1

void Fraig_NodeVecPushOrderByLevel(Fraig_NodeVec_t *p,Fraig_Node_t *pNode)

{
  Fraig_Node_t **ppFVar1;
  Fraig_Node_t *pFVar2;
  long lVar3;
  
  Fraig_NodeVecPush(p,pNode);
  if (1 < (long)p->nSize) {
    lVar3 = (long)p->nSize + 1;
    do {
      ppFVar1 = p->pArray;
      pFVar2 = ppFVar1[lVar3 + -2];
      if (*(int *)(((ulong)pFVar2 & 0xfffffffffffffffe) + 8) <=
          *(int *)(((ulong)ppFVar1[lVar3 + -3] & 0xfffffffffffffffe) + 8)) {
        return;
      }
      ppFVar1[lVar3 + -2] = ppFVar1[lVar3 + -3];
      p->pArray[lVar3 + -3] = pFVar2;
      lVar3 = lVar3 + -1;
    } while (2 < lVar3);
  }
  return;
}

Assistant:

void Fraig_NodeVecPushOrderByLevel( Fraig_NodeVec_t * p, Fraig_Node_t * pNode )
{
    Fraig_Node_t * pNode1, * pNode2;
    int i;
    Fraig_NodeVecPush( p, pNode );
    // find the p of the node
    for ( i = p->nSize-1; i > 0; i-- )
    {
        pNode1 = p->pArray[i  ];
        pNode2 = p->pArray[i-1];
        if ( Fraig_Regular(pNode1)->Level <= Fraig_Regular(pNode2)->Level )
            break;
        p->pArray[i  ] = pNode2;
        p->pArray[i-1] = pNode1;
    }
}